

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_getopt(nni_dialer *d,char *name,void *valp,size_t *szp,nni_type t)

{
  int iVar1;
  bool bVar2;
  int rv_2;
  int rv_1;
  int rv;
  nni_option *o;
  nni_type t_local;
  size_t *szp_local;
  void *valp_local;
  char *name_local;
  nni_dialer *d_local;
  
  iVar1 = strcmp(name,"reconnect-time-max");
  if (iVar1 == 0) {
    nni_mtx_lock(&d->d_mtx);
    d_local._4_4_ = nni_copyout_ms(d->d_maxrtime,valp,szp,t);
    nni_mtx_unlock(&d->d_mtx);
  }
  else {
    iVar1 = strcmp(name,"reconnect-time-min");
    if (iVar1 == 0) {
      nni_mtx_lock(&d->d_mtx);
      d_local._4_4_ = nni_copyout_ms(d->d_inirtime,valp,szp,t);
      nni_mtx_unlock(&d->d_mtx);
    }
    else if (((d->d_ops).d_getopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0
             ) || (d_local._4_4_ = (*(d->d_ops).d_getopt)(d->d_data,name,valp,szp,t),
                  d_local._4_4_ == 9)) {
      _rv_1 = (d->d_ops).d_options;
      while( true ) {
        bVar2 = false;
        if (_rv_1 != (nni_option *)0x0) {
          bVar2 = _rv_1->o_name != (char *)0x0;
        }
        if (!bVar2) {
          iVar1 = nni_sock_getopt(d->d_sock,name,valp,szp,t);
          return iVar1;
        }
        iVar1 = strcmp(_rv_1->o_name,name);
        if (iVar1 == 0) break;
        _rv_1 = _rv_1 + 1;
      }
      if (_rv_1->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
        d_local._4_4_ = 0x19;
      }
      else {
        d_local._4_4_ = (*_rv_1->o_get)(d->d_data,valp,szp,t);
      }
    }
  }
  return d_local._4_4_;
}

Assistant:

int
nni_dialer_getopt(
    nni_dialer *d, const char *name, void *valp, size_t *szp, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_maxrtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_inirtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_getopt != NULL) {
		int rv = d->d_ops.d_getopt(d->d_data, name, valp, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}
	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(d->d_data, valp, szp, t));
	}

	return (nni_sock_getopt(d->d_sock, name, valp, szp, t));
}